

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_plane.cpp
# Opt level: O0

void __thiscall ON_Plane::Dump(ON_Plane *this,ON_TextLog *text_log)

{
  ON_TextLog *text_log_local;
  ON_Plane *this_local;
  
  ON_TextLog::Print(text_log,"plane equation: ");
  ON_PlaneEquation::Dump(&this->plane_equation,text_log);
  ON_TextLog::PrintNewLine(text_log);
  ON_TextLog::PushIndent(text_log);
  ON_TextLog::Print(text_log,"xaxis=");
  ON_TextLog::Print(text_log,&this->xaxis);
  ON_TextLog::Print(text_log,", yaxis=");
  ON_TextLog::Print(text_log,&this->yaxis);
  ON_TextLog::Print(text_log,", zaxis=");
  ON_TextLog::Print(text_log,&this->zaxis);
  ON_TextLog::Print(text_log,", origin=");
  ON_TextLog::Print(text_log,&this->origin);
  ON_TextLog::PrintNewLine(text_log);
  ON_TextLog::PopIndent(text_log);
  return;
}

Assistant:

void ON_Plane::Dump(class ON_TextLog& text_log) const
{
  text_log.Print("plane equation: ");
  plane_equation.Dump(text_log);
  text_log.PrintNewLine();
  text_log.PushIndent();
  text_log.Print("xaxis=");
  text_log.Print(xaxis);
  text_log.Print(", yaxis=");
  text_log.Print(yaxis);
  text_log.Print(", zaxis=");
  text_log.Print(zaxis);
  text_log.Print(", origin=");
  text_log.Print(origin);
  text_log.PrintNewLine();
  text_log.PopIndent();
}